

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O2

void test_multiple_syncs(rtr_socket *socket)

{
  ulong uVar1;
  int iVar2;
  size_t i;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  aspa_record *paVar6;
  uint32_t sn;
  uint32_t sn_00;
  uint16_t in_SI;
  uint16_t uVar7;
  aspa_record *records;
  rtr_socket *socket_00;
  size_t in_R8;
  int iVar8;
  size_t record_count;
  undefined4 uVar9;
  undefined1 *puVar10;
  int iVar11;
  long in_FS_OFFSET;
  undefined8 uStack_22b0;
  aspa_record local_22a8;
  undefined1 local_2288 [8264];
  undefined8 uStack_240;
  undefined1 auStack_238 [8];
  ulong local_230;
  ulong local_228;
  rtr_socket *local_220;
  undefined1 *local_218;
  aspa_record *local_210;
  ulong local_208;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  undefined4 local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  undefined1 local_1b8 [8];
  update_callback _callbacks850 [3];
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  undefined4 local_128;
  int local_124;
  int local_120;
  int local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  aspa_record _records821 [2];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [8];
  update_callback _callbacks813 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_240 = 0x1066c0;
  begin_cache_response((uint8_t)socket,in_SI);
  local_48 = 0x300000002;
  uStack_40 = 0x500000004;
  uStack_240 = 0x1066e1;
  append_aspa('\x01','\x01',(uint32_t)&local_48,(uint32_t *)0x4,in_R8);
  _callbacks813[1].type = 3;
  _callbacks813[1]._33_7_ = 0x4000000;
  uVar7 = 2;
  uStack_240 = 0x1066fc;
  append_aspa('\x01','\x02',(int)_callbacks813 + 0x48,(uint32_t *)0x4,in_R8);
  uStack_240 = 0x106706;
  end_cache_response(0xb5,uVar7,sn);
  expected_callbacks = (update_callback *)local_a8;
  local_a8 = (undefined1  [8])0x0;
  _callbacks813[0].source._0_4_ = 1;
  _callbacks813[0].record.customer_asn = 4;
  _callbacks813[0].record._4_4_ = 0;
  _callbacks813[0].record.provider_count = (size_t)&local_b8;
  _callbacks813[0].record.provider_asns._0_1_ = 1;
  _callbacks813[0].type = ASPA_REMOVE;
  _callbacks813[0]._33_7_ = 0;
  local_b8 = 0x300000002;
  uStack_b0 = 0x500000004;
  _callbacks813[1].source._0_4_ = 2;
  _callbacks813[1].record.customer_asn = 4;
  _callbacks813[1].record._4_4_ = 0;
  _callbacks813[1].record.provider_count = (size_t)&_records821[1].provider_asns;
  _records821[1].provider_asns = (uint32_t *)0x400000003;
  _callbacks813[1].record.provider_asns._0_1_ = 1;
  callback_count = 2;
  callback_index = 0;
  uStack_240 = 0x106780;
  iVar2 = rtr_sync(socket);
  if (iVar2 != 0) {
    uStack_240 = 0x106b87;
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x32f,"void test_multiple_syncs(struct rtr_socket *)");
  }
  if (callback_index == callback_count) {
    records = (aspa_record *)local_f8;
    local_f8._0_4_ = 1;
    _records821[0].customer_asn = 4;
    _records821[0]._4_4_ = 0;
    _records821[0].provider_count = (size_t)&local_108;
    local_108 = 0x300000002;
    uStack_100 = 0x500000004;
    _records821[0].provider_asns._0_4_ = 2;
    _records821[1].customer_asn = 4;
    _records821[1]._4_4_ = 0;
    _records821[1].provider_count = (size_t)&local_118;
    local_118 = 0x400000003;
    uStack_110 = 0x600000005;
    uStack_240 = 0x1067f0;
    socket_00 = socket;
    assert_table(socket,records,2);
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      (&local_22a8.customer_asn)[lVar3] = (int)lVar3 + 3;
    }
    puVar10 = local_2288;
    uStack_22b0 = 5;
    local_1ec = 5;
    paVar6 = &local_22a8;
    uVar5 = 1;
    local_220 = socket;
    local_218 = auStack_238;
    while( true ) {
      if (uVar5 == 0x104) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return;
        }
        *(code **)(local_218 + -8) = test_many_pdus;
        __stack_chk_fail();
      }
      iVar2 = (int)uVar5 * 2;
      uStack_22b0 = 0x10684c;
      local_210 = paVar6;
      begin_cache_response((uint8_t)socket_00,(uint16_t)records);
      local_228 = uVar5 & 0xffffffff;
      uStack_22b0 = 0x106861;
      append_aspa('\0',(uint8_t)local_228,0,(uint32_t *)0x0,in_R8);
      uVar1 = uVar5 * 2 + 2;
      uVar9 = (undefined4)uVar1;
      local_1f0 = iVar2 + 3;
      iVar8 = iVar2 + 4;
      iVar11 = iVar2 + 5;
      local_1f8 = iVar2 + 1;
      uStack_22b0 = 0x1068c5;
      local_230 = uVar5;
      local_1fc = iVar8;
      local_1f4 = iVar11;
      local_128 = uVar9;
      local_124 = local_1f0;
      local_120 = iVar8;
      local_11c = iVar11;
      append_aspa('\x01',(uint8_t)local_1f8,(uint32_t)&local_128,(uint32_t *)0x4,in_R8);
      uVar5 = local_230;
      local_138 = local_1f0;
      uVar7 = (uint16_t)(uVar1 & 0xffffffff);
      uStack_22b0 = 0x106908;
      local_134 = iVar8;
      local_130 = iVar11;
      local_12c = iVar2 + 6;
      append_aspa('\x01',(uint8_t)(uVar1 & 0xffffffff),(uint32_t)&local_138,(uint32_t *)0x4,in_R8);
      uStack_22b0 = 0x106912;
      end_cache_response(0xbc,uVar7,sn_00);
      socket_00 = local_220;
      local_208 = uVar5 + 1;
      local_1c8 = (undefined4)local_208;
      record_count = uVar5 + 2;
      local_1c4 = (undefined4)record_count;
      _callbacks850[0].source._0_4_ = (int)local_228;
      local_1c0 = (int)_callbacks850[0].source + 3;
      local_1b8 = (undefined1  [8])0x0;
      local_1bc = (int)_callbacks850[0].source + 4;
      _callbacks850[0].record.customer_asn = 4;
      _callbacks850[0].record._4_4_ = 0;
      _callbacks850[0].record.provider_count = (size_t)&local_1c8;
      _callbacks850[0].record.provider_asns._0_1_ = 0;
      _callbacks850[0].type = ASPA_REMOVE;
      _callbacks850[0]._33_7_ = 0;
      _callbacks850[1].source._0_4_ = local_1f8;
      local_1d4 = local_1f0;
      local_1e8 = local_1f0;
      local_1d0 = local_1fc;
      local_1e4 = local_1fc;
      local_1cc = local_1f4;
      local_1e0 = local_1f4;
      _callbacks850[1].record.customer_asn = 4;
      _callbacks850[1].record._4_4_ = 0;
      _callbacks850[1].record.provider_count = (size_t)&local_1d8;
      _callbacks850[1].record.provider_asns._0_1_ = 1;
      _callbacks850[1].type = ASPA_REMOVE;
      _callbacks850[1]._33_7_ = 0;
      _callbacks850[2].record.customer_asn = 4;
      _callbacks850[2].record._4_4_ = 0;
      _callbacks850[2].record.provider_count = (size_t)&local_1e8;
      _callbacks850[2].record.provider_asns._0_1_ = 1;
      expected_callbacks = (update_callback *)local_1b8;
      callback_count = 3;
      callback_index = 0;
      uStack_22b0 = 0x106a40;
      local_1dc = iVar2 + 6;
      local_1d8 = uVar9;
      _callbacks850[2].source._0_4_ = uVar9;
      iVar2 = rtr_sync(local_220);
      if (iVar2 != 0) break;
      if (callback_index != callback_count) {
        uStack_22b0 = 0x106b49;
        __assert_fail("callback_index == callback_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                      ,0x354,"void test_multiple_syncs(struct rtr_socket *)");
      }
      uStack_22b0 = 0xfffffffffffffff0;
      iVar2 = local_1ec;
      for (lVar3 = -0x10; lVar3 != 0; lVar3 = lVar3 + 4) {
        *(int *)(puVar10 + lVar3) = iVar2 + -1;
        *(int *)(puVar10 + lVar3 + 0x10) = iVar2;
        iVar2 = iVar2 + 1;
      }
      uVar5 = record_count * 0x18 + 0xf & 0xfffffffffffffff0;
      lVar3 = -uVar5;
      records = (aspa_record *)((long)&local_22a8 + lVar3);
      plVar4 = (long *)((long)&local_22a8 + (0x10 - uVar5));
      paVar6 = local_210;
      for (uVar5 = local_208; uVar5 <= uVar1; uVar5 = uVar5 + 1) {
        *(int *)(plVar4 + -2) = (int)uVar5;
        plVar4[-1] = 4;
        *plVar4 = (long)paVar6;
        paVar6 = (aspa_record *)&paVar6->provider_asns;
        plVar4 = plVar4 + 3;
      }
      *(undefined8 *)((long)&uStack_22b0 + lVar3) = 0x106adc;
      assert_table(socket_00,records,record_count);
      puVar10 = puVar10 + 0x20;
      local_1ec = local_1ec + 2;
      paVar6 = (aspa_record *)&local_210->provider_asns;
      uVar5 = local_208;
    }
    uStack_22b0 = 0x106b68;
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x353,"void test_multiple_syncs(struct rtr_socket *)");
  }
  uStack_240 = 0x106ba6;
  __assert_fail("callback_index == callback_count",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                ,0x330,"void test_multiple_syncs(struct rtr_socket *)");
}

Assistant:

static void test_multiple_syncs(struct rtr_socket *socket)
{
	const size_t PROVIDER_COUNT = 4;
	// amount of ASPAs to be withdrawn (twice as much are added)
	const size_t N = 256 + 4;

	// initial cycle: add two new aspas
	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1, ASNS(2, 3, 4, 5));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 2, ASNS(3, 4, 5, 6));
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 437);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(1, ASNS(2, 3, 4, 5))),
		ADDED(RECORD(2, ASNS(3, 4, 5, 6))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(1, ASNS(2, 3, 4, 5)),
		RECORD(2, ASNS(3, 4, 5, 6)),
	);

	// repeated cycle: withdraw one, announce two new
	// store expected provider asns, starting with providers for c_an = 2
	uint32_t provider_asns[(2 * N - 1) * PROVIDER_COUNT];

	// enter provider_asns for ASPA record 2 => {3, 4, 5, 6}
	for (size_t i = 0; i < PROVIDER_COUNT; i++)
		provider_asns[i] = i + 3;

	// customer asn to be withdrawn
	for (uint32_t c_wd = 1; c_wd < N; c_wd++) {
		// first customer asn to be announced
		uint32_t c_an = 2 * c_wd + 1;

		begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
		APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_WITHDRAW, c_wd,
			ASNS());
		APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, c_an,
			ASNS(c_an + 1, c_an + 2, c_an + 3, c_an + 4));
		APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, c_an + 1,
			ASNS(c_an + 2, c_an + 3, c_an + 4, c_an + 5));

		end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 444);

		EXPECT_UPDATE_CALLBACKS(
			REMOVED(RECORD(c_wd, ASNS(c_wd + 1, c_wd + 2, c_wd + 3, c_wd + 4))),
			ADDED(RECORD(c_an, ASNS(c_an + 1, c_an + 2, c_an + 3, c_an + 4))),
			ADDED(RECORD(c_an + 1, ASNS(c_an + 2, c_an + 3, c_an + 4, c_an + 5))),
		);
		assert(rtr_sync(socket) == RTR_SUCCESS);
		assert(callback_index == callback_count);

		// store announced ASPAs' providers for validation
		for (size_t i = 0; i < PROVIDER_COUNT; i++) {
			provider_asns[PROVIDER_COUNT * (size_t)(c_an - 2) + i] = c_an + (uint32_t)i + 1;
			provider_asns[PROVIDER_COUNT * (size_t)(c_an - 1) + i] = c_an + (uint32_t)i + 2;
		}

		// build array of all records expected to be in aspa_table
		// (customer asns after last withdrawn until including last announced)
		size_t record_count = c_wd + 2;
		struct aspa_record records[record_count];

		for (size_t c_ex = c_wd + 1; c_ex <= c_an + 1; c_ex++) {
			records[c_ex - (c_wd + 1)] =
				((struct aspa_record) {
					.customer_asn = (uint32_t)c_ex,
					.provider_count = PROVIDER_COUNT,
					.provider_asns = &provider_asns[PROVIDER_COUNT * (c_ex - 2)]
				});
		}
		assert_table(socket, records, record_count);
	}
}